

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseProperties
          (AsciiParser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          *props,vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames)

{
  ulong uVar1;
  bool bVar2;
  ostream *poVar3;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames_00;
  string tok;
  ostringstream ss_e;
  string local_1d0;
  string local_1b0;
  ostringstream local_190 [376];
  
  bVar2 = SkipWhitespace(this);
  if (bVar2) {
    uVar1 = this->_sr->idx_;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_local_buf[0] = '\0';
    bVar2 = ReadIdentifier(this,&local_1d0);
    if (bVar2) {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1d0,"rel");
      if (!bVar2) {
        if (uVar1 <= this->_sr->length_) {
          this->_sr->idx_ = uVar1;
        }
        ::std::__cxx11::string::_M_dispose();
        bVar2 = ParsePrimProps(this,props,propNames_00);
        return bVar2;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_190);
      poVar3 = ::std::operator<<((ostream *)local_190,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseProperties");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x11d9);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_190,"TODO: Parse rel");
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_1b0);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream(local_190);
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return false;
}

Assistant:

bool AsciiParser::ParseProperties(std::map<std::string, Property> *props,
                                  std::vector<value::token> *propNames) {
  // property : primm_attr
  //          | 'rel' name '=' path
  //          ;

  if (!SkipWhitespace()) {
    return false;
  }

  // rel?
  {
    uint64_t loc = CurrLoc();
    std::string tok;

    if (!ReadIdentifier(&tok)) {
      return false;
    }

    if (tok == "rel") {
      PUSH_ERROR_AND_RETURN("TODO: Parse rel");
    } else {
      SeekTo(loc);
    }
  }

  // attribute
  return ParsePrimProps(props, propNames);
}